

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void __thiscall CChat::HandleCommands(CChat *this,float x,float y,float w)

{
  ulong uVar1;
  bool *pbVar2;
  byte bVar3;
  bool *pbVar4;
  ITextRender *pIVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  char *pcVar17;
  int iVar18;
  CCommand *pCVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  long in_FS_OFFSET;
  bool bVar24;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aVar25;
  float fVar26;
  CUIRect Rect_1;
  CUIRect Rect;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 local_84;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_7c;
  vec4 local_68;
  vec4 local_58;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_48;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 local_44;
  float local_40;
  anon_union_4_2_94730017_for_vector4_base<float>_7 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_Mode == 0) || (pcVar8 = (this->m_Input).m_pStr, *pcVar8 != '/')) ||
     ((this->m_IgnoreCommand & 1U) != 0)) goto LAB_00139f7e;
  FilterChatCommands(this,pcVar8);
  iVar18 = (this->m_CommandManager).m_aCommands.num_elements;
  iVar9 = iVar18 - this->m_FilteredCount;
  iVar23 = 0x10;
  if (iVar9 < 0x10) {
    iVar23 = iVar9;
  }
  iVar18 = iVar18 - this->m_FilteredCount;
  if (iVar18 == 0) goto LAB_00139f7e;
  pbVar4 = (this->m_aFilter).list;
  if (pbVar4[this->m_SelectedCommand] == true) {
    this->m_SelectedCommand = -1;
    uVar11 = (this->m_aFilter).num_elements;
    uVar14 = 0;
    uVar21 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar21 = uVar14;
    }
    do {
      if (uVar21 == uVar14) goto LAB_001397d9;
      uVar1 = uVar14 + 1;
      pbVar2 = pbVar4 + uVar14;
      uVar14 = uVar1;
    } while (*pbVar2 != false);
    uVar21 = (ulong)((int)uVar1 - 1);
LAB_001397d9:
    this->m_SelectedCommand = (int)uVar21;
  }
  iVar9 = this->m_CommandStart;
  lVar15 = (long)iVar9;
  if (pbVar4[lVar15] == true) {
    iVar20 = (this->m_aFilter).num_elements;
    iVar6 = iVar9 + 1;
    if (iVar9 + 1 < iVar20) {
      iVar6 = iVar20;
    }
    do {
      lVar15 = lVar15 + 1;
      iVar10 = iVar6;
      if (iVar20 <= lVar15) break;
      iVar9 = iVar9 + 1;
      iVar10 = iVar9;
    } while (pbVar4[lVar15] != false);
    this->m_CommandStart = iVar10;
  }
  if (iVar18 < 1) goto LAB_00139f7e;
  aVar25.w = (float)(iVar23 + 1) * 8.0;
  local_58.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3e000000;
  local_58.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3e000000;
  local_58.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3e000000;
  local_58.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
  local_48.x = x;
  local_44.y = y - aVar25.w;
  local_40 = w;
  local_3c.w = aVar25.w;
  CUIRect::Draw((CUIRect *)&local_48,&local_58,3.0,0xf);
  uVar11 = this->m_CommandStart;
  uVar13 = uVar11;
  if (iVar18 != 1) {
    iVar9 = 2;
    if (2 < iVar23) {
      iVar9 = iVar23;
    }
    uVar22 = (this->m_aFilter).num_elements;
    iVar20 = 0;
    do {
      lVar15 = (long)(int)uVar13;
      uVar12 = uVar13;
      uVar7 = uVar13 + 1;
      if ((int)(uVar13 + 1) < (int)uVar22) {
        uVar7 = uVar22;
      }
      do {
        lVar15 = lVar15 + 1;
        uVar13 = uVar7;
        if ((int)uVar22 <= lVar15) break;
        uVar13 = uVar12 + 1;
        uVar12 = uVar13;
      } while ((this->m_aFilter).list[lVar15] != false);
      bVar24 = iVar20 != iVar9 + -2;
      iVar20 = iVar20 + 1;
    } while (bVar24);
  }
  iVar9 = (this->m_CommandManager).m_aCommands.num_elements;
  if ((iVar9 <= (int)uVar13) && (-1 < (int)(uVar13 - iVar9))) {
    iVar20 = uVar13 - iVar9;
    do {
      uVar21 = (ulong)uVar11;
      uVar22 = (int)uVar11 >> 0x1f & uVar11;
      do {
        uVar21 = uVar21 - 1;
        uVar7 = uVar22 - 1;
        if ((int)uVar11 < 1) break;
        uVar11 = uVar11 - 1;
        uVar7 = uVar11;
      } while ((this->m_aFilter).list[uVar21 & 0xffffffff] != false);
      uVar11 = uVar7;
      bVar24 = 0 < iVar20;
      iVar20 = iVar20 + -1;
    } while (bVar24);
    this->m_CommandStart = uVar11;
  }
  if (this->m_SelectedCommand < (int)uVar11) {
    uVar21 = (ulong)uVar11;
    uVar13 = (int)uVar11 >> 0x1f & uVar11;
    do {
      uVar21 = uVar21 - 1;
      uVar7 = uVar13 - 1;
      if ((int)uVar11 < 1) break;
      uVar11 = uVar11 - 1;
      uVar7 = uVar11;
    } while ((this->m_aFilter).list[uVar21 & 0xffffffff] != false);
LAB_001399ab:
    uVar11 = uVar7;
    this->m_CommandStart = uVar11;
  }
  else if ((int)uVar13 < this->m_SelectedCommand) {
    uVar13 = (this->m_aFilter).num_elements;
    lVar15 = (long)(int)uVar11;
    uVar22 = uVar11 + 1;
    if ((int)(uVar11 + 1) < (int)uVar13) {
      uVar22 = uVar13;
    }
    do {
      lVar15 = lVar15 + 1;
      uVar7 = uVar22;
      if ((int)uVar13 <= lVar15) break;
      uVar11 = uVar11 + 1;
      uVar7 = uVar11;
    } while ((this->m_aFilter).list[lVar15] != false);
    goto LAB_001399ab;
  }
  local_7c.z = w;
  if (0x10 < iVar18) {
    local_7c.z = w + -6.0;
    local_58.field_0.x = x + local_7c.z;
    local_58.field_2.z = 6.0;
    local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3e000000;
    local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3e000000;
    local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3e000000;
    local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
    local_58.field_3.w = aVar25.w;
    local_58.field_1.y = y - aVar25.w;
    CUIRect::Draw((CUIRect *)&local_58,&local_68,3.0,10);
    aVar25 = local_58.field_3;
    local_58.field_3.w = ((float)iVar23 / (float)iVar18) * local_58.field_3.w;
    lVar15 = (long)(this->m_CommandManager).m_aCommands.num_elements;
    iVar9 = -1;
    if (0 < lVar15) {
      lVar16 = 0;
      do {
        if ((this->m_aFilter).list[lVar16] != true) {
          iVar9 = (int)lVar16;
          break;
        }
        lVar16 = lVar16 + 1;
      } while (lVar15 != lVar16);
    }
    fVar26 = 0.0;
    if (iVar9 < this->m_CommandStart) {
      lVar15 = (long)iVar9;
      iVar9 = 0;
      do {
        pbVar4 = (this->m_aFilter).list + lVar15;
        lVar15 = lVar15 + 1;
        iVar9 = iVar9 + (*pbVar4 ^ 1);
      } while (this->m_CommandStart != lVar15);
      fVar26 = (float)iVar9;
    }
    local_58.field_1.y = (aVar25.w * fVar26) / (float)iVar18 + local_58.field_1.y;
    local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f000000;
    local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f000000;
    local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f000000;
    local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
    CUIRect::Draw((CUIRect *)&local_58,&local_68,3.0,10);
    uVar11 = this->m_CommandStart;
    iVar9 = (this->m_CommandManager).m_aCommands.num_elements;
  }
  local_84.y = y + (float)(iVar23 + 2) * -8.0;
  if ((int)uVar11 < iVar9) {
    lVar15 = (long)(int)uVar11;
    iVar18 = 0;
LAB_00139b2c:
    if (((this->m_aFilter).list[lVar15] == false) &&
       (pCVar19 = (this->m_CommandManager).m_aCommands.list,
       pCVar19 != (CCommand *)0x0 && -1 < lVar15)) {
      pCVar19 = pCVar19 + lVar15;
      local_84.y = local_84.y + 8.0;
      local_58.field_1.y = local_84.y;
      local_58.field_0.x = local_48.x;
      local_58.field_3.w = 7.0;
      local_58.field_2.z = local_7c.z;
      if (pCVar19->m_pfnCallback == ServerCommandCallback) {
        local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
        local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f19999a;
        local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f19999a;
        local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e4ccccd;
        CUIRect::Draw((CUIRect *)&local_58,&local_68,0.0,0xf);
      }
      if (this->m_SelectedCommand == (int)lVar15) {
        local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3e800000;
        local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3e800000;
        local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f19999a;
        local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f666666;
        CUIRect::Draw((CUIRect *)&local_58,&local_68,2.0,0xf);
      }
      if ((HandleCommands(float,float,float)::s_CommandCursor == '\0') &&
         (iVar9 = __cxa_guard_acquire(&HandleCommands(float,float,float)::s_CommandCursor),
         iVar9 != 0)) {
        CTextCursor::CTextCursor(&HandleCommands::s_CommandCursor,5.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&HandleCommands::s_CommandCursor,&__dso_handle);
        __cxa_guard_release(&HandleCommands(float,float,float)::s_CommandCursor);
      }
      iVar18 = iVar18 + 1;
      CTextCursor::Reset(&HandleCommands::s_CommandCursor,-1);
      HandleCommands::s_CommandCursor.m_CursorPos.field_0.x = local_48.x + 5.0;
      HandleCommands::s_CommandCursor.m_CursorPos.field_1.y = local_84.y;
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                (pIVar5,&HandleCommands::s_CommandCursor,pCVar19,0xffffffff);
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                (pIVar5,&HandleCommands::s_CommandCursor," ",0xffffffff);
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0,0x3f000000,0x3f000000,0x3f800000);
      pcVar8 = pCVar19->m_aArgsFormat;
      do {
        bVar3 = *pcVar8;
        if (bVar3 < 0x70) {
          if (bVar3 == 99) {
            pcVar17 = "<subcommand> ";
            goto LAB_00139d19;
          }
          pcVar17 = "<number> ";
          if (bVar3 == 0x69) goto LAB_00139d19;
          if (bVar3 == 0) goto LAB_00139d37;
        }
        else {
          if (bVar3 == 0x70) {
            pcVar17 = "<playername> ";
          }
          else {
            if (bVar3 != 0x73) goto LAB_00139d32;
            pcVar17 = "<text> ";
          }
LAB_00139d19:
          pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                    (pIVar5,&HandleCommands::s_CommandCursor,pcVar17,0xffffffff);
        }
LAB_00139d32:
        pcVar8 = pcVar8 + 1;
      } while( true );
    }
    goto LAB_00139dd5;
  }
LAB_00139e38:
  if ((HandleCommands(float,float,float)::s_NotificationCursor == '\0') &&
     (iVar18 = __cxa_guard_acquire(&HandleCommands(float,float,float)::s_NotificationCursor),
     iVar18 != 0)) {
    CTextCursor::CTextCursor(&HandleCommands::s_NotificationCursor,5.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&HandleCommands::s_NotificationCursor,&__dso_handle);
    __cxa_guard_release(&HandleCommands(float,float,float)::s_NotificationCursor);
  }
  CTextCursor::Reset(&HandleCommands::s_NotificationCursor,-1);
  HandleCommands::s_NotificationCursor.m_CursorPos.field_0.x = local_48.x + 5.0;
  HandleCommands::s_NotificationCursor.m_CursorPos.field_1.y = local_84.y + 8.0;
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  iVar18 = this->m_SelectedCommand;
  if ((long)iVar18 < 0) {
LAB_00139efc:
    pcVar8 = "Press Tab to select or Esc to cancel";
  }
  else {
    pCVar19 = (CCommand *)0x0;
    if (iVar18 < (this->m_CommandManager).m_aCommands.num_elements) {
      pCVar19 = (this->m_CommandManager).m_aCommands.list + iVar18;
    }
    pcVar8 = str_startswith((this->m_Input).m_pStr + 1,pCVar19->m_aName);
    if (pcVar8 == (char *)0x0) goto LAB_00139efc;
    pcVar8 = "Press Enter to confirm or Esc to cancel";
  }
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  pcVar8 = Localize(pcVar8,"");
  (*(pIVar5->super_IInterface)._vptr_IInterface[7])
            (pIVar5,&HandleCommands::s_NotificationCursor,pcVar8,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar5,&HandleCommands::s_NotificationCursor,0,0xffffffff);
LAB_00139f7e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_00139d37:
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[7])
            (pIVar5,&HandleCommands::s_CommandCursor,pCVar19->m_aHelpText,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar5,&HandleCommands::s_CommandCursor,0,0xffffffff);
  iVar9 = (this->m_CommandManager).m_aCommands.num_elements;
LAB_00139dd5:
  if ((iVar23 <= iVar18) || (lVar15 = lVar15 + 1, iVar9 <= lVar15)) goto LAB_00139e38;
  goto LAB_00139b2c;
}

Assistant:

void CChat::HandleCommands(float x, float y, float w)
{
	// render commands menu
	if(m_Mode != CHAT_NONE && IsTypingCommand())
	{
		const float Alpha = 0.90f;
		const float ScrollBarW = 6.0f;
		float LineWidth = w;
		const float LineHeight = 8.0f;

		FilterChatCommands(m_Input.GetString()); // flag active commands, update selected command
		const int ActiveCount = m_CommandManager.CommandCount() - m_FilteredCount;
		const int DisplayCount = minimum(ActiveCount, 16);

		if(DisplayCount && m_aFilter[m_SelectedCommand])
		{
			m_SelectedCommand = -1;
			NextActiveCommand(&m_SelectedCommand);
		}
		if(DisplayCount && m_aFilter[m_CommandStart])
		{
			NextActiveCommand(&m_CommandStart);
		}

		if(DisplayCount > 0) // at least one command to display
		{
			CUIRect Rect = {x, y-(DisplayCount+1)*LineHeight, LineWidth, (DisplayCount+1)*LineHeight};
			Rect.Draw(vec4(0.125f, 0.125f, 0.125f, Alpha), 3.0f);

			int End = m_CommandStart;
			for(int i = 0; i < DisplayCount - 1; i++)
				NextActiveCommand(&End);

			if(End >= m_CommandManager.CommandCount())
				for(int i = End - m_CommandManager.CommandCount(); i >= 0; i--)
					PreviousActiveCommand(&m_CommandStart);

			if(m_SelectedCommand < m_CommandStart)
			{
				PreviousActiveCommand(&m_CommandStart);
			}
			else if(m_SelectedCommand > End)
			{
				NextActiveCommand(&m_CommandStart);
				NextActiveCommand(&End);
			}

			// render worlds most inefficient "scrollbar"
			if(ActiveCount > DisplayCount)
			{
				LineWidth -= ScrollBarW;

				CUIRect Rect = {x + LineWidth, y - (DisplayCount + 1) * LineHeight, ScrollBarW, (DisplayCount+1)*LineHeight};
				Rect.Draw(vec4(0.125f, 0.125f, 0.125f, Alpha), 3.0f, CUIRect::CORNER_R);

				float h = Rect.h;
				Rect.h *= (float)DisplayCount/ActiveCount;
				Rect.y += h * (float)(GetActiveCountRange(GetFirstActiveCommand(), m_CommandStart))/ActiveCount;
				Rect.Draw(vec4(0.5f, 0.5f, 0.5f, Alpha), 3.0f, CUIRect::CORNER_R);
			}

			y -= (DisplayCount+2)*LineHeight;
			for(int i = m_CommandStart, j = 0; j < DisplayCount && i < m_CommandManager.CommandCount(); i++)
			{
				if(m_aFilter[i])
					continue;

				const CCommandManager::CCommand *pCommand = m_CommandManager.GetCommand(i);
				if(!pCommand)
					continue;

				j++;

				y += LineHeight;
				CUIRect HighlightRect = {Rect.x, y, LineWidth, LineHeight-1};

				if(pCommand->m_pfnCallback == ServerCommandCallback)
					HighlightRect.Draw(vec4(0.0f, 0.6f, 0.6f, 0.2f), 0);

				// draw selection box
				if(i == m_SelectedCommand)
					HighlightRect.Draw(vec4(0.25f, 0.25f, 0.6f, Alpha), 2.0f);

				// print command
				static CTextCursor s_CommandCursor(5.0f);
				s_CommandCursor.Reset();
				s_CommandCursor.MoveTo(Rect.x + 5.0f, y);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->TextDeferred(&s_CommandCursor, pCommand->m_aName, -1);
				TextRender()->TextDeferred(&s_CommandCursor, " ", -1);

				TextRender()->TextColor(0.0f, 0.5f, 0.5f, 1.0f);
				for(const char *pArg = pCommand->m_aArgsFormat; *pArg; pArg++)
				{
					if(*pArg == 'i') // Integer argument
						TextRender()->TextDeferred(&s_CommandCursor, "<number> ", -1);
					else if(*pArg == 'p') // Player name argument
						TextRender()->TextDeferred(&s_CommandCursor, "<playername> ", -1);
					else if(*pArg == 's') // String argument
						TextRender()->TextDeferred(&s_CommandCursor, "<text> ", -1);
					else if(*pArg == 'c') // Subcommand argument
						TextRender()->TextDeferred(&s_CommandCursor, "<subcommand> ", -1);
				}
				TextRender()->TextColor(0.5f, 0.5f, 0.5f, 1.0f);
				TextRender()->TextDeferred(&s_CommandCursor, pCommand->m_aHelpText, -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->DrawTextOutlined(&s_CommandCursor);
			}

			// render notification
			{
				y += LineHeight;
				static CTextCursor s_NotificationCursor(5.0f);
				s_NotificationCursor.Reset();
				s_NotificationCursor.MoveTo(Rect.x + 5.0f, y);
				TextRender()->TextColor(0.5f, 0.5f, 0.5f, 1.0f);
				if(m_SelectedCommand >= 0 && str_startswith(m_Input.GetString() + 1, m_CommandManager.GetCommand(m_SelectedCommand)->m_aName))
					TextRender()->TextDeferred(&s_NotificationCursor, Localize("Press Enter to confirm or Esc to cancel"), -1);
				else
					TextRender()->TextDeferred(&s_NotificationCursor, Localize("Press Tab to select or Esc to cancel"), -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->DrawTextOutlined(&s_NotificationCursor);
			}
		}
	}
}